

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.cpp
# Opt level: O3

void __thiscall
presolve::HighsPostsolveStack::DuplicateColumn::undoFix
          (DuplicateColumn *this,HighsOptions *options,HighsSolution *solution)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  HighsCDouble HVar13;
  double local_f8;
  HighsCDouble local_d0;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  
  local_b0 = (options->super_HighsOptionsStruct).mip_feasibility_tolerance;
  dVar8 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  iVar3 = this->col;
  local_98 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar3];
  dVar9 = this->colScale;
  local_a8 = this->colLower;
  bVar1 = this->colIntegral;
  bVar2 = this->duplicateColIntegral;
  iVar4 = this->duplicateCol;
  uStack_90 = 0;
  if (bVar1 == true) {
    local_a8 = ceil(local_a8 - local_b0);
    uStack_a0 = extraout_XMM0_Qb;
    local_88 = floor(this->colUpper + local_b0);
    uStack_80 = extraout_XMM0_Qb_00;
    if (bVar2 != false) goto LAB_002f6328;
    local_c0 = this->duplicateColLower;
    local_b8 = this->duplicateColUpper;
  }
  else {
    local_88 = this->colUpper;
    uStack_80 = 0;
    uStack_a0 = 0;
    if (bVar2 == false) {
      local_d0.hi = this->duplicateColLower;
      local_b8 = this->duplicateColUpper;
      local_c0 = local_d0.hi;
      if (-INFINITY < local_d0.hi) {
        local_d0.lo = 0.0;
        HVar13 = HighsCDouble::operator*(&local_d0,dVar9);
        dVar7 = local_98 - HVar13.hi;
        dVar7 = (((-HVar13.hi - (dVar7 - local_98)) + (local_98 - (dVar7 - (dVar7 - local_98))) +
                 0.0) - HVar13.lo) + dVar7;
      }
      else {
        dVar7 = *(double *)(&DAT_003be0f0 + (ulong)(0.0 < dVar9) * 8);
      }
      if (local_b8 < INFINITY) {
        local_d0.lo = 0.0;
        local_d0.hi = local_b8;
        HVar13 = HighsCDouble::operator*(&local_d0,dVar9);
        dVar10 = local_98 - HVar13.hi;
        dVar10 = (((-HVar13.hi - (dVar10 - local_98)) + (local_98 - (dVar10 - (dVar10 - local_98)))
                  + 0.0) - HVar13.lo) + dVar10;
      }
      else {
        dVar10 = *(double *)(&DAT_003c7860 + (ulong)(0.0 < dVar9) * 8);
      }
      dVar12 = local_c0;
      if (dVar9 <= 0.0) {
        if (local_c0 == -INFINITY) {
          if (local_b8 == INFINITY) goto LAB_002f6e95;
          local_f8 = dVar8 + local_88;
          dVar12 = local_b8;
          if (dVar10 <= local_f8) goto LAB_002f6c5c;
          local_d0.hi = local_98 - local_88;
          local_d0.lo = (-local_88 - (local_d0.hi - local_98)) +
                        (local_98 - (local_d0.hi - (local_d0.hi - local_98))) + 0.0;
          HighsCDouble::operator/=(&local_d0,dVar9);
          dVar12 = local_d0.hi + local_d0.lo;
          dVar10 = local_88;
          if (local_c0 - dVar8 <= dVar12) goto LAB_002f6c5c;
        }
        else {
          local_f8 = local_a8 - dVar8;
          dVar10 = dVar7;
          if (local_f8 <= dVar7) goto LAB_002f6c5c;
          local_d0.hi = local_98 - local_a8;
          local_d0.lo = (-local_a8 - (local_d0.hi - local_98)) +
                        (local_98 - (local_d0.hi - (local_d0.hi - local_98))) + 0.0;
          HighsCDouble::operator/=(&local_d0,dVar9);
          dVar12 = local_d0.hi + local_d0.lo;
          dVar10 = local_a8;
          if (dVar12 <= dVar8 + local_b8) goto LAB_002f6c5c;
        }
      }
      else if (local_b8 == INFINITY) {
        if (local_c0 == -INFINITY) {
LAB_002f6e95:
          dVar10 = local_a8;
          if (local_a8 <= 0.0) {
            dVar10 = 0.0;
          }
          local_d0.hi = local_98 - dVar10;
          local_d0.lo = (-dVar10 - (local_d0.hi - local_98)) +
                        (local_98 - (local_d0.hi - (local_d0.hi - local_98))) + 0.0;
          HighsCDouble::operator/=(&local_d0,dVar9);
          dVar12 = local_d0.hi + local_d0.lo;
          goto LAB_002f6c5c;
        }
        local_f8 = dVar8 + local_88;
        dVar10 = dVar7;
        if (dVar7 <= local_f8) goto LAB_002f6c5c;
        local_d0.hi = local_98 - local_88;
        local_d0.lo = (-local_88 - (local_d0.hi - local_98)) +
                      (local_98 - (local_d0.hi - (local_d0.hi - local_98))) + 0.0;
        HighsCDouble::operator/=(&local_d0,dVar9);
        dVar12 = local_d0.hi + local_d0.lo;
        dVar10 = local_88;
        if (dVar12 <= dVar8 + local_b8) goto LAB_002f6c5c;
      }
      else {
        local_f8 = local_a8 - dVar8;
        dVar12 = local_b8;
        if (local_f8 <= dVar10) goto LAB_002f6c5c;
        local_d0.hi = local_98 - local_a8;
        local_d0.lo = (-local_a8 - (local_d0.hi - local_98)) +
                      (local_98 - (local_d0.hi - (local_d0.hi - local_98))) + 0.0;
        HighsCDouble::operator/=(&local_d0,dVar9);
        dVar12 = local_d0.hi + local_d0.lo;
        dVar10 = local_a8;
        if (local_c0 - dVar8 <= dVar12) goto LAB_002f6c5c;
      }
      local_d0.hi = local_98 - local_f8;
      local_d0.lo = (-local_f8 - (local_d0.hi - local_98)) +
                    (local_98 - (local_d0.hi - (local_d0.hi - local_98))) + 0.0;
      HighsCDouble::operator/=(&local_d0,dVar9);
      dVar12 = local_d0.hi + local_d0.lo;
      dVar10 = local_f8;
      goto LAB_002f6c5c;
    }
LAB_002f6328:
    local_c0 = ceil(this->duplicateColLower - local_b0);
    local_b8 = floor(this->duplicateColUpper + local_b0);
    if (bVar1 == false) {
      if (-INFINITY < local_c0) {
        local_78 = 1.0;
        dVar7 = local_b8;
        uStack_50 = extraout_XMM0_Qb_01;
        dVar11 = local_c0;
      }
      else {
        dVar11 = 0.0;
        if (INFINITY > local_b8) {
          dVar11 = local_b8;
        }
        local_78 = *(double *)(&DAT_003be0c0 + (ulong)(INFINITY <= local_b8) * 8);
        uStack_50 = 0;
        dVar7 = -1000.0;
      }
      local_58 = (double)(~-(ulong)(INFINITY <= local_b8) & (ulong)dVar7 |
                         -(ulong)(INFINITY <= local_b8) & 0x408f400000000000);
      dVar7 = local_a8 - dVar8;
      local_48 = local_58 + 1e-08;
      uStack_40 = 0;
      local_58 = local_58 + -1e-08;
      local_68 = dVar8 + local_88;
      uStack_70 = 0;
      do {
        dVar12 = dVar11;
        local_d0.lo = 0.0;
        local_d0.hi = dVar12;
        HVar13 = HighsCDouble::operator*(&local_d0,dVar9);
        dVar10 = local_98 - HVar13.hi;
        dVar10 = (((-HVar13.hi - (dVar10 - local_98)) + (local_98 - (dVar10 - (dVar10 - local_98)))
                  + 0.0) - HVar13.lo) + dVar10;
        if (((dVar7 <= dVar10) && (dVar10 <= local_68)) ||
           (dVar11 = local_78 + dVar12, local_48 <= dVar11 && 0.0 < local_78)) break;
      } while (local_58 < dVar11 || 0.0 <= local_78);
      goto LAB_002f6c5c;
    }
  }
  if (-INFINITY < local_a8) {
    local_68 = (double)(~-(ulong)(INFINITY <= local_88) & (ulong)local_88 |
                       -(ulong)(INFINITY <= local_88) & 0x408f400000000000);
    local_48 = 1.0;
    dVar7 = local_a8;
    uStack_60 = uStack_80;
  }
  else {
    dVar7 = 0.0;
    if (INFINITY > local_88) {
      dVar7 = local_88;
    }
    lVar6 = (ulong)(INFINITY <= local_88) * 8;
    local_48 = *(double *)(&DAT_003be0c0 + lVar6);
    local_68 = *(double *)(&DAT_003d08d0 + lVar6);
    uStack_60 = 0;
  }
  local_78 = local_c0 - dVar8;
  local_38 = dVar8 + local_b8;
  local_58 = local_68 + 1e-08;
  uStack_50 = 0;
  local_68 = local_68 + -1e-08;
  uStack_40 = 0;
  while( true ) {
    dVar10 = dVar7;
    local_d0.hi = local_98 - dVar10;
    local_d0.lo = (-dVar10 - (local_d0.hi - local_98)) +
                  (local_98 - (local_d0.hi - (local_d0.hi - local_98))) + 0.0;
    HighsCDouble::operator/=(&local_d0,dVar9);
    dVar12 = local_d0.hi + local_d0.lo;
    if (((local_78 <= dVar12) && (dVar12 <= local_38)) &&
       ((bVar2 == false || (dVar7 = round(dVar12), ABS(dVar12 - dVar7) <= local_b0)))) break;
    dVar7 = local_48 + dVar10;
    if ((local_58 <= dVar7 && 0.0 < local_48) || (dVar7 <= local_68 && local_48 < 0.0)) break;
  }
LAB_002f6c5c:
  local_f8 = dVar10;
  local_d0.lo = 0.0;
  local_d0.hi = dVar12;
  HVar13 = HighsCDouble::operator*(&local_d0,dVar9);
  local_78 = HVar13.hi;
  if ((local_a8 - dVar8 <= local_f8) &&
     (((local_f8 <= local_88 + dVar8 && (local_c0 - dVar8 <= dVar12)) &&
      (dVar12 <= dVar8 + local_b8)))) {
    if (bVar1 != false) {
      dVar8 = round(local_f8);
      HVar13.lo = HVar13.lo;
      HVar13.hi = local_78;
      if (local_b0 < ABS(local_f8 - dVar8)) {
        return;
      }
    }
    local_78 = HVar13.hi;
    if (bVar2 == false) {
      if (0x7fefffffffffffff < (ulong)ABS(local_f8)) {
        return;
      }
    }
    else {
      dVar8 = round(dVar12);
      HVar13.lo = HVar13.lo;
      HVar13.hi = local_78;
      if (0x7fefffffffffffff < (ulong)ABS(local_f8)) {
        return;
      }
      if (local_b0 < ABS(dVar12 - dVar8)) {
        return;
      }
    }
    if ((ulong)ABS(dVar12) < 0x7ff0000000000000) {
      dVar8 = local_f8 + HVar13.hi;
      dVar9 = dVar8 - local_98;
      if (ABS((-local_98 - (dVar9 - dVar8)) + (dVar8 - (dVar9 - (dVar9 - dVar8))) +
              HVar13.lo +
              (HVar13.hi - (dVar8 - local_f8)) + (local_f8 - (dVar8 - (dVar8 - local_f8))) + 0.0 +
              dVar9) <= 1e-12) {
        pdVar5 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5[iVar3] = local_f8;
        pdVar5[iVar4] = dVar12;
      }
    }
  }
  return;
}

Assistant:

void HighsPostsolveStack::DuplicateColumn::undoFix(
    const HighsOptions& options, HighsSolution& solution) const {
  const double mip_feasibility_tolerance = options.mip_feasibility_tolerance;
  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  std::vector<double>& col_value = solution.col_value;
  const bool allow_assert = false;
  const bool debug_report = false;
  //=============================================================================================

  auto isInteger = [&](const double v) {
    return (fractionality(v) <= mip_feasibility_tolerance);
  };

  auto isFeasible = [&](const double l, const double v, const double u) {
    return v >= l - primal_feasibility_tolerance &&
           v <= u + primal_feasibility_tolerance;
  };
  const double merge_value = col_value[col];
  const double value_max = 1000;
  const double eps = 1e-8;
  const double scale = colScale;
  const bool x_int = colIntegral;
  const bool y_int = duplicateColIntegral;
  const int x_ix = col;
  const int y_ix = duplicateCol;
  const double x_lo =
      x_int ? std::ceil(colLower - mip_feasibility_tolerance) : colLower;
  const double x_up =
      x_int ? std::floor(colUpper + mip_feasibility_tolerance) : colUpper;
  const double y_lo =
      y_int ? std::ceil(duplicateColLower - mip_feasibility_tolerance)
            : duplicateColLower;
  const double y_up =
      y_int ? std::floor(duplicateColUpper + mip_feasibility_tolerance)
            : duplicateColUpper;
  if (kAllowDeveloperAssert) assert(scale);
  double x_v = merge_value;
  double y_v;

  //  assert(x_int);
  //  assert(y_int);
  //  assert(scale < 0);
  if (x_int) {
    double x_0 = 0;
    double x_d = 0;
    double x_1 = 0;
    double x_free = false;
    if (x_lo <= -kHighsInf) {
      if (x_up >= kHighsInf) {
        // x is free
        x_free = true;
        x_0 = 0;
        x_d = 1.0;
        x_1 = value_max;
      } else {
        // x is (-int, u]
        x_0 = x_up;
        x_d = -1.0;
        x_1 = -value_max;
      }
    } else {
      if (x_up >= kHighsInf) {
        // x is [l, inf)
        x_0 = x_lo;
        x_d = 1.0;
        x_1 = value_max;
      } else {
        // x is [l, u]
        x_0 = x_lo;
        x_d = 1.0;
        x_1 = x_up;
      }
    }
    // x is integer, so look through its possible values to find a
    // suitable y
    if (x_free && debug_report) printf("DuplicateColumn::undo x is free\n");
    if (debug_report)
      printf("DuplicateColumn::undo Using x (%g; %g; %g)\n", x_0, x_d, x_1);
    bool found_y = false;
    for (x_v = x_0;; x_v += x_d) {
      //      printf("x_v = %g\n", x_v);
      y_v = double((HighsCDouble(merge_value) - x_v) / scale);
      if (isFeasible(y_lo, y_v, y_up)) {
        found_y = !y_int || isInteger(y_v);
        if (found_y) break;
      }
      if (x_d > 0 && x_v + x_d >= x_1 + eps) break;
      if (x_d < 0 && x_v + x_d <= x_1 - eps) break;
    }
    if (allow_assert) assert(found_y);
  } else if (y_int) {
    double y_0 = 0;
    double y_d = 0;
    double y_1 = 0;
    double y_free = false;
    if (y_lo <= -kHighsInf) {
      if (y_up >= kHighsInf) {
        // y is free
        y_free = true;
        y_0 = 0;
        y_d = 1.0;
        y_1 = value_max;
      } else {
        // y is (-int, u]
        y_0 = y_up;
        y_d = -1.0;
        y_1 = -value_max;
      }
    } else {
      if (y_up >= kHighsInf) {
        // y is [l, inf)
        y_0 = y_lo;
        y_d = 1.0;
        y_1 = value_max;
      } else {
        // y is [l, u]
        y_0 = y_lo;
        y_d = 1.0;
        y_1 = y_up;
      }
    }
    // y is integer, so look through its possible values to find a
    // suitable x
    if (y_free && debug_report) printf("DuplicateColumn::undo y is free\n");
    if (debug_report)
      printf("DuplicateColumn::undo Using y (%g; %g; %g)\n", y_0, y_d, y_1);
    bool found_x = false;
    for (y_v = y_0;; y_v += y_d) {
      //      printf("y_v = %g\n", y_v);
      x_v = double((HighsCDouble(merge_value) - HighsCDouble(y_v) * scale));
      if (isFeasible(x_lo, x_v, x_up)) {
        found_x = !x_int || isInteger(x_v);
        if (found_x) break;
      }
      if (y_d > 0 && y_v + y_d >= y_1 + eps) break;
      if (y_d < 0 && y_v + y_d <= y_1 - eps) break;
    }
    if (allow_assert) assert(found_x);
  } else {
    // x and y are both continuous
    double v_m_a_ylo = 0;
    double v_m_a_yup = 0;
    if (y_lo <= -kHighsInf) {
      v_m_a_ylo = scale > 0 ? kHighsInf : -kHighsInf;
    } else {
      v_m_a_ylo =
          double((HighsCDouble(merge_value) - HighsCDouble(y_lo) * scale));
    }
    if (y_up >= kHighsInf) {
      v_m_a_yup = scale > 0 ? -kHighsInf : kHighsInf;
    } else {
      v_m_a_yup =
          double((HighsCDouble(merge_value) - HighsCDouble(y_up) * scale));
    }
    // Need to ensure that y puts x in [x_l, x_u]
    if (scale > 0) {
      if (debug_report)
        printf("DuplicateColumn::undo [V-a(y_u), V-a(y_l)] == [%g, %g]\n",
               v_m_a_yup, v_m_a_ylo);
      // V-ay is in [V-a(y_u), V-a(y_l)] == [v_m_a_yup, v_m_a_ylo]
      if (y_up < kHighsInf) {
        // If v_m_a_yup is right of x_up+eps then [v_m_a_yup, v_m_a_ylo] is
        // right of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_ylo computed from y_lo-eps.]
        if (kAllowDeveloperAssert)
          assert(x_up + primal_feasibility_tolerance >= v_m_a_yup);
        // This assignment is OK unless x_v < x_lo-eps
        y_v = y_up;
        x_v = v_m_a_yup;
        if (x_v < x_lo - primal_feasibility_tolerance) {
          // Try y_v corresponding to x_lo
          x_v = x_lo;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v < y_lo - primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            x_v = x_lo - primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else if (y_lo > -kHighsInf) {
        // If v_m_a_ylo is left of x_lo-eps then [v_m_a_yup, v_m_a_ylo] is
        // left of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_yup computed from y_up+eps.]
        if (kAllowDeveloperAssert)
          assert(x_lo - primal_feasibility_tolerance <= v_m_a_ylo);
        // This assignment is OK unless x_v > x_up-eps
        y_v = y_lo;
        x_v = v_m_a_ylo;
        if (x_v > x_up + primal_feasibility_tolerance) {
          // Try y_v corresponding to x_up
          //	  if (kAllowDeveloperAssert) assert(1==102);
          x_v = x_up;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v > y_up + primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            if (debug_report) printf("DuplicateColumn::undoFix 2==102\n");
            if (kAllowDeveloperAssert) assert(2 == 102);
            x_v = x_up + primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else {
        // y is free, so use x_v = max(0, x_lo)
        x_v = std::max(0.0, x_lo);
        y_v = double((HighsCDouble(merge_value) - x_v) / scale);
      }
    } else {  // scale < 0
      if (debug_report)
        printf("DuplicateColumn::undo [V-a(y_l), V-a(y_u)] == [%g, %g]\n",
               v_m_a_ylo, v_m_a_yup);
      // V-ay is in [V-a(y_l), V-a(y_u)] == [v_m_a_ylo, v_m_a_yup]
      //
      if (y_lo > -kHighsInf) {
        // If v_m_a_ylo is right of x_up+eps then [v_m_a_ylo, v_m_a_yup] is
        // right of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_ylo computed from y_up+eps.]
        if (kAllowDeveloperAssert)
          assert(x_up + primal_feasibility_tolerance >= v_m_a_ylo);
        // This assignment is OK unless x_v < x_lo-eps
        y_v = y_lo;
        x_v = v_m_a_ylo;
        if (x_v < x_lo - primal_feasibility_tolerance) {
          // Try y_v corresponding to x_lo
          //	  if (kAllowDeveloperAssert) assert(11==101);
          x_v = x_lo;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v > y_up + primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            if (debug_report) printf("DuplicateColumn::undoFix 12==101\n");
            if (kAllowDeveloperAssert) assert(12 == 101);
            x_v = x_lo - primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else if (y_up < kHighsInf) {
        // If v_m_a_yup is left of x_lo-eps then [v_m_a_ylo, v_m_a_yup] is
        // left of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_yup computed from y_lo-eps.]
        if (kAllowDeveloperAssert)
          assert(x_lo - primal_feasibility_tolerance <= v_m_a_yup);
        // This assignment is OK unless x_v < x_lo-eps
        y_v = y_up;
        x_v = v_m_a_yup;
        if (x_v > x_up + primal_feasibility_tolerance) {
          // Try y_v corresponding to x_up
          //	  if (kAllowDeveloperAssert) assert(11==102);
          x_v = x_up;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v < y_lo - primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            if (debug_report) printf("DuplicateColumn::undoFix 12==102\n");
            if (kAllowDeveloperAssert) assert(12 == 102);
            x_v = x_up + primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else {
        // y is free, so use x_v = max(0, x_lo)
        x_v = std::max(0.0, x_lo);
        y_v = double((HighsCDouble(merge_value) - x_v) / scale);
      }
    }
  }
  const double residual_tolerance = 1e-12;
  double residual =
      std::fabs(double(HighsCDouble(x_v) + HighsCDouble(y_v) * scale -
                       HighsCDouble(merge_value)));
  const bool x_y_ok =
      isFeasible(x_lo, x_v, x_up) && isFeasible(y_lo, y_v, y_up) &&
      (!x_int || isInteger(x_v)) && (!y_int || isInteger(y_v)) &&
      (std::fabs(x_v) < kHighsInf) && (std::fabs(y_v) < kHighsInf) &&
      (residual <= residual_tolerance);

  bool check;
  check = isFeasible(x_lo, x_v, x_up);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: isFeasible(x_lo, x_v, x_up) is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = isFeasible(y_lo, y_v, y_up);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: isFeasible(y_lo, y_v, y_up) is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = !x_int || isInteger(x_v);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: !x_int || isInteger(x_v) is false\n");
    if (allow_assert) assert(check);
  }
  check = !y_int || isInteger(y_v);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: !y_int || isInteger(y_v) is false\n");
    if (allow_assert) assert(check);
  }
  check = std::fabs(x_v) < kHighsInf;
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: std::fabs(x_v) < kHighsInf is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = std::fabs(y_v) < kHighsInf;
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: std::fabs(y_v) < kHighsInf is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = residual <= residual_tolerance;
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: residual <= residual_tolerance is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = residual <= residual_tolerance;
  if (debug_report)
    printf("DuplicateColumn::undo%s x = %g; y = %g to give x + (%g)y = %g",
           x_y_ok ? "" : " ERROR", x_v, y_v, scale, merge_value);
  if (x_y_ok) {
    if (debug_report) printf(": FIXED\n");
  } else if (check) {
    if (debug_report) printf("\n");
  } else {
    if (debug_report) printf(": residual = %g\n", residual);
  }
  //=============================================================================================
  if (x_y_ok) {
    col_value[x_ix] = x_v;
    col_value[y_ix] = y_v;
  }
}